

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O0

void __thiscall ReferenceMeaning::Dump(ReferenceMeaning *this,ostream *out)

{
  ostream *poVar1;
  ostream *out_local;
  ReferenceMeaning *this_local;
  
  poVar1 = std::operator<<(out,"(meaning-ref ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->up_index);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->right_index);
  std::operator<<(poVar1,")");
  return;
}

Assistant:

void Dump(std::ostream &out) override {
    out << "(meaning-ref " << up_index << " " << right_index << ")";
  }